

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O2

int64_t Assimp::FBX::ParseTokenAsInt64(Token *t,char **err_out)

{
  int64_t iVar1;
  char *pcVar2;
  uint length;
  char *out;
  uint local_24;
  char *local_20;
  
  *err_out = (char *)0x0;
  if (t->type == TokenType_DATA) {
    if (t->column == 0xffffffff) {
      if (*t->sbegin == 'L') {
        return *(int64_t *)(t->sbegin + 1);
      }
      pcVar2 = "failed to parse Int64, unexpected data type";
    }
    else {
      local_24 = *(int *)&t->send - (int)t->sbegin;
      local_20 = (char *)0x0;
      iVar1 = strtol10_64(t->sbegin,&local_20,&local_24);
      if (local_20 <= t->send) {
        return iVar1;
      }
      pcVar2 = "failed to parse Int64 (text)";
    }
  }
  else {
    pcVar2 = "expected TOK_DATA token";
  }
  *err_out = pcVar2;
  return 0;
}

Assistant:

int64_t ParseTokenAsInt64(const Token& t, const char*& err_out)
{
    err_out = NULL;

    if (t.Type() != TokenType_DATA) {
        err_out = "expected TOK_DATA token";
        return 0L;
    }

    if (t.IsBinary())
    {
        const char* data = t.begin();
        if (data[0] != 'L') {
            err_out = "failed to parse Int64, unexpected data type";
            return 0L;
        }

        BE_NCONST int64_t id = SafeParse<int64_t>(data + 1, t.end());
        AI_SWAP8(id);
        return id;
    }

    // XXX: should use size_t here
    unsigned int length = static_cast<unsigned int>(t.end() - t.begin());
    ai_assert(length > 0);

    const char* out = nullptr;
    const int64_t id = strtol10_64(t.begin(), &out, &length);
    if (out > t.end()) {
        err_out = "failed to parse Int64 (text)";
        return 0L;
    }

    return id;
}